

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# authority_suite.cpp
# Opt level: O0

void __thiscall
reader_authority_suite::test_ipv6_line_7c_v6::test_method(test_ipv6_line_7c_v6 *this)

{
  undefined8 uVar1;
  bool bVar2;
  lazy_ostream *plVar3;
  view_type *pvVar4;
  basic_cstring<const_char> local_138;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_128;
  basic_cstring<const_char> local_100;
  basic_cstring<const_char> local_f0;
  undefined4 local_dc;
  value local_d8 [4];
  basic_cstring<const_char> local_c8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_b8;
  basic_cstring<const_char> local_90;
  basic_cstring<const_char> local_80;
  basic_string_ref<char,_std::char_traits<char>_> local_70;
  undefined1 local_60 [8];
  authority reader;
  char input [28];
  test_ipv6_line_7c_v6 *this_local;
  
  reader.super_base<char,_trial::url::reader::basic_authority>.current_token = 0x3131315b;
  reader.super_base<char,_trial::url::reader::basic_authority>._36_4_ = 0x32323a31;
  boost::basic_string_ref<char,_std::char_traits<char>_>::basic_string_ref
            (&local_70,
             (char *)&reader.super_base<char,_trial::url::reader::basic_authority>.current_token);
  trial::url::reader::basic_authority<char>::basic_authority
            ((basic_authority<char> *)local_60,&local_70);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_80,
               "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/authority_suite.cpp"
               ,0x65);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_90);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_80,0x179,&local_90);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_b8,plVar3,(char (*) [1])0x1b56e9);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_c8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/authority_suite.cpp"
               ,0x65);
    local_d8[0] = trial::url::reader::base<char,_trial::url::reader::basic_authority>::subcode
                            ((base<char,_trial::url::reader::basic_authority> *)local_60);
    local_dc = 6;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,trial::url::token::subcode::value,trial::url::token::subcode::value>
              (&local_b8,&local_c8,0x179,2,2,local_d8,"reader.subcode()",&local_dc,
               "url::token::subcode::authority_host_ipv6");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_b8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_f0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/authority_suite.cpp"
               ,0x65);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_100);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_f0,0x17a,&local_100);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_128,plVar3,(char (*) [1])0x1b56e9);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_138,
               "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/authority_suite.cpp"
               ,0x65);
    pvVar4 = trial::url::reader::base<char,_trial::url::reader::basic_authority>::literal
                       ((base<char,_trial::url::reader::basic_authority> *)local_60);
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,boost::basic_string_ref<char,std::char_traits<char>>,char[26]>
              (&local_128,&local_138,0x17a,2,2,pvVar4,"reader.literal()","1111:2222:3333::1234:5678"
               ,"\"1111:2222:3333::1234:5678\"");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_128);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(test_ipv6_line_7c_v6)
{
    const char input[] = "[1111:2222:3333::1234:5678]";
    url::reader::authority reader(input);
    BOOST_REQUIRE_EQUAL(reader.subcode(), url::token::subcode::authority_host_ipv6);
    BOOST_REQUIRE_EQUAL(reader.literal(), "1111:2222:3333::1234:5678");
}